

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::DirectoryInputNodeTask::provideValue
          (DirectoryInputNodeTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  int iVar1;
  BuildValue value;
  BinaryDecoder local_a0;
  BuildValue local_88;
  
  if (inputID != 0) {
    local_a0.data.Data =
         (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    local_a0.data.Length =
         (long)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)local_a0.data.Data;
    local_a0.pos = 0;
    llbuild::buildsystem::BuildValue::BuildValue(&local_88,&local_a0);
    iVar1 = this->finishedBlockingDeps + 1;
    this->finishedBlockingDeps = iVar1;
    if (iVar1 == this->totalBlockingDeps) {
      performUnblockedRequest(this,ti);
    }
    llbuild::buildsystem::BuildValue::~BuildValue(&local_88);
    return;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->directorySignature,valueData);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    if (inputID == 0) {
      directorySignature = valueData;
    } else {
      auto value = BuildValue::fromData(valueData);

      ++finishedBlockingDeps;
      if (finishedBlockingDeps == totalBlockingDeps) {
        // All paths within mustScanAfterPaths are scanned..
        // DirectoryTreeSignature is unblocked
        performUnblockedRequest(ti);
      }
    }
  }